

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sha1.cpp
# Opt level: O2

ON_SHA1_Hash *
ON_SHA1_Hash::StringHash
          (ON_SHA1_Hash *__return_storage_ptr__,ON_wString *str,ON__UINT64 *byte_count)

{
  int iVar1;
  wchar_t *str_00;
  
  ON_wString::IsValid(str,false);
  str_00 = ON_wString::operator_cast_to_wchar_t_(str);
  iVar1 = ON_wString::Length(str);
  StringHash(__return_storage_ptr__,str_00,(long)iVar1,byte_count);
  return __return_storage_ptr__;
}

Assistant:

ON_SHA1_Hash ON_SHA1_Hash::StringHash(
  const ON_wString& str,
  ON__UINT64& byte_count
  )
{
  // Do not permit corrupt strings to crash this code.
  str.IsValid(false);

  return ON_SHA1_Hash::StringHash(
    static_cast<const wchar_t*>(str),
    (size_t)str.Length(),
    byte_count
    );
}